

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

void __thiscall duckdb::Binder::SetActiveBinder(Binder *this,ExpressionBinder *binder)

{
  vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true> *this_00;
  reference pvVar1;
  
  this_00 = GetActiveBinders(this);
  pvVar1 = vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true>::back(this_00);
  pvVar1->_M_data = binder;
  return;
}

Assistant:

void Binder::SetActiveBinder(ExpressionBinder &binder) {
	D_ASSERT(HasActiveBinder());
	GetActiveBinders().back() = binder;
}